

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

string * __thiscall helics::helicsIntString_abi_cxx11_(int64_t val)

{
  string *in_RDI;
  undefined1 in_stack_000001b0 [16];
  undefined1 in_stack_000001c0 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  undefined8 local_70;
  undefined1 *local_68;
  char *local_60;
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_8;
  
  local_48 = "{}";
  local_40 = 2;
  local_50 = local_98;
  local_60 = "{}";
  local_58 = 2;
  local_28 = local_88;
  local_18 = &local_70;
  local_20 = local_88;
  local_70 = 3;
  local_8 = local_28;
  local_68 = local_20;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000001c0,(format_args)in_stack_000001b0);
  return in_RDI;
}

Assistant:

std::string helicsIntString(std::int64_t val)
{
    return fmt::format("{}", val);
}